

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

void cmSystemTools::ParseWindowsCommandLine
               (char *command,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  char *c;
  string arg;
  value_type local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  uVar4 = 0;
  bVar5 = false;
  bVar2 = false;
  local_38 = args;
  do {
    cVar1 = *command;
    if (cVar1 == '\"') {
      std::__cxx11::string::_M_replace_aux
                ((ulong)&local_58,local_58._M_string_length,0,(char)((int)uVar4 >> 1));
      if ((uVar4 & 1) == 0) {
        bVar5 = (bool)(bVar5 ^ 1);
        bVar2 = true;
        uVar4 = 0;
      }
      else {
        bVar2 = true;
        uVar4 = 0;
        std::__cxx11::string::_M_replace_aux((ulong)&local_58,local_58._M_string_length,0,'\x01');
      }
    }
    else if (cVar1 == '\\') {
      uVar4 = uVar4 + 1;
      bVar2 = true;
    }
    else {
      if (cVar1 == '\0') {
        std::__cxx11::string::_M_replace_aux
                  ((ulong)&local_58,local_58._M_string_length,0,(char)uVar4);
        if (bVar2) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(local_38,&local_58);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,
                          CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                   local_58.field_2._M_local_buf[0]) + 1);
        }
        return;
      }
      std::__cxx11::string::_M_replace_aux((ulong)&local_58,local_58._M_string_length,0,(char)uVar4)
      ;
      if (-1 < *command) {
        iVar3 = isspace((int)*command);
        if (iVar3 != 0) {
          uVar4 = 0;
          if (bVar5) {
            std::__cxx11::string::_M_replace_aux
                      ((ulong)&local_58,local_58._M_string_length,0,'\x01');
          }
          else if (bVar2) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(local_38,&local_58);
            local_58._M_string_length = 0;
            *local_58._M_dataplus._M_p = '\0';
            uVar4 = 0;
            bVar2 = false;
          }
          goto LAB_001be3e3;
        }
      }
      bVar2 = true;
      uVar4 = 0;
      std::__cxx11::string::_M_replace_aux((ulong)&local_58,local_58._M_string_length,0,'\x01');
    }
LAB_001be3e3:
    command = command + 1;
  } while( true );
}

Assistant:

void cmSystemTools::ParseWindowsCommandLine(const char* command,
                                            std::vector<std::string>& args)
{
  // See the MSDN document "Parsing C Command-Line Arguments" at
  // http://msdn2.microsoft.com/en-us/library/a1y7w461.aspx for rules
  // of parsing the windows command line.

  bool in_argument = false;
  bool in_quotes = false;
  int backslashes = 0;
  std::string arg;
  for (const char* c = command; *c; ++c) {
    if (*c == '\\') {
      ++backslashes;
      in_argument = true;
    } else if (*c == '"') {
      int backslash_pairs = backslashes >> 1;
      int backslash_escaped = backslashes & 1;
      arg.append(backslash_pairs, '\\');
      backslashes = 0;
      if (backslash_escaped) {
        /* An odd number of backslashes precede this quote.
           It is escaped.  */
        arg.append(1, '"');
      } else {
        /* An even number of backslashes precede this quote.
           It is not escaped.  */
        in_quotes = !in_quotes;
      }
      in_argument = true;
    } else {
      arg.append(backslashes, '\\');
      backslashes = 0;
      if (cm_isspace(*c)) {
        if (in_quotes) {
          arg.append(1, *c);
        } else if (in_argument) {
          args.push_back(arg);
          arg.clear();
          in_argument = false;
        }
      } else {
        in_argument = true;
        arg.append(1, *c);
      }
    }
  }
  arg.append(backslashes, '\\');
  if (in_argument) {
    args.push_back(arg);
  }
}